

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor * ggml_pad_reflect_1d(ggml_context *ctx,ggml_tensor *a,int p0,int p1)

{
  long lVar1;
  _Bool _Var2;
  ggml_tensor *pgVar3;
  char *pcVar4;
  int line;
  char *file;
  long local_58;
  int64_t local_50;
  int64_t iStack_48;
  int64_t local_40;
  
  if (p0 < 0) {
    file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c";
    pcVar4 = "p0 >= 0";
    line = 0x10c2;
  }
  else if (p1 < 0) {
    file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c";
    pcVar4 = "p1 >= 0";
    line = 0x10c3;
  }
  else {
    lVar1 = a->ne[0];
    if ((long)(ulong)(uint)p0 < lVar1) {
      if ((long)(ulong)(uint)p1 < lVar1) {
        _Var2 = ggml_is_contiguous_n(a,0);
        if (_Var2) {
          if (a->type == GGML_TYPE_F32) {
            local_58 = (ulong)(uint)p1 + (ulong)(uint)p0 + lVar1;
            local_40 = a->ne[3];
            local_50 = a->ne[1];
            iStack_48 = a->ne[2];
            pgVar3 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,4,&local_58,(ggml_tensor *)0x0,0);
            if (pgVar3 != (ggml_tensor *)0x0) {
              pgVar3->op_params[0] = p0;
              pgVar3->op_params[1] = p1;
              pgVar3->op = GGML_OP_PAD_REFLECT_1D;
              pgVar3->src[0] = a;
              return pgVar3;
            }
            file = 
            "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-impl.h";
            pcVar4 = "tensor != NULL";
            line = 0x70;
          }
          else {
            file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c";
            pcVar4 = "a->type == GGML_TYPE_F32";
            line = 0x10c9;
          }
        }
        else {
          file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c";
          pcVar4 = "ggml_is_contiguous(a)";
          line = 0x10c8;
        }
      }
      else {
        file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c";
        pcVar4 = "p1 < a->ne[0]";
        line = 0x10c6;
      }
    }
    else {
      file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c";
      pcVar4 = "p0 < a->ne[0]";
      line = 0x10c5;
    }
  }
  ggml_abort(file,line,"GGML_ASSERT(%s) failed",pcVar4);
}

Assistant:

struct ggml_tensor * ggml_pad_reflect_1d(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int                   p0,
        int                   p1) {
    GGML_ASSERT(p0 >= 0);
    GGML_ASSERT(p1 >= 0);

    GGML_ASSERT(p0 < a->ne[0]); // padding length on each size must be less than the
    GGML_ASSERT(p1 < a->ne[0]); // existing length of the dimension being padded

    GGML_ASSERT(ggml_is_contiguous(a));
    GGML_ASSERT(a->type == GGML_TYPE_F32);

    struct ggml_tensor * result = ggml_new_tensor_4d(ctx, a->type,
            a->ne[0] + p0 + p1,
            a->ne[1],
            a->ne[2],
            a->ne[3]);

    int32_t params[] = { p0, p1 };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_PAD_REFLECT_1D;
    result->src[0] = a;

    return result;
}